

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

_Bool get_long_from_string(char *s,long *val)

{
  _Bool _Var1;
  long lVar2;
  long lval;
  char *endptr;
  long *val_local;
  char *s_local;
  
  endptr = (char *)val;
  val_local = (long *)s;
  lVar2 = strtol(s,(char **)&lval,10);
  if ((((char)*val_local == '\0') ||
      (((*(char *)lval != '\0' && (_Var1 = contains_only_spaces((char *)lval), !_Var1)) ||
       (lVar2 < -0x7fffffffffffffff)))) || (0x7ffffffffffffffe < lVar2)) {
    s_local._7_1_ = false;
  }
  else {
    *(long *)endptr = lVar2;
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool get_long_from_string(const char *s, long *val)
{
	char *endptr;
	long lval = strtol(s, &endptr, 10);

	/*
	 * Reject LONG_MIN and LONG_MAX so it isn't necessary to check errno
	 * to see if the value in the string was out of range.
	 */
	if (s[0] == '\0' ||
			(*endptr != '\0' && !contains_only_spaces(endptr)) ||
			lval <= LONG_MIN || lval >= LONG_MAX) {
		return false;
	}
	*val = lval;
	return true;
}